

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

Node<QString,_QList<QString>_> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<QString,_QList<QString>_>_>::findNode<QString>
          (Data<QHashPrivate::Node<QString,_QList<QString>_>_> *this,QString *key)

{
  byte bVar1;
  size_t hash;
  Node<QString,_QList<QString>_> *pNVar2;
  QStringView QVar3;
  Bucket BVar4;
  
  QVar3.m_data = (key->d).ptr;
  QVar3.m_size = (key->d).size;
  hash = qHash(QVar3,this->seed);
  BVar4 = findBucketWithHash<QString>(this,key,hash);
  bVar1 = (BVar4.span)->offsets[BVar4.index];
  if (bVar1 == 0xff) {
    pNVar2 = (Node<QString,_QList<QString>_> *)0x0;
  }
  else {
    pNVar2 = (Node<QString,_QList<QString>_> *)
             (((BVar4.span)->entries->storage).data + (uint)bVar1 * 0x30);
  }
  return pNVar2;
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }